

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int detach_set_handle(DETACH_HANDLE detach,handle handle_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE handle_amqp_value;
  DETACH_INSTANCE *detach_instance;
  int result;
  handle handle_value_local;
  DETACH_HANDLE detach_local;
  
  if (detach == (DETACH_HANDLE)0x0) {
    detach_instance._0_4_ = 0x24b6;
  }
  else {
    item_value = amqpvalue_create_handle(handle_value);
    if (item_value == (AMQP_VALUE)0x0) {
      detach_instance._0_4_ = 0x24be;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(detach->composite_value,0,item_value);
      if (iVar1 == 0) {
        detach_instance._0_4_ = 0;
      }
      else {
        detach_instance._0_4_ = 0x24c4;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)detach_instance;
}

Assistant:

int detach_set_handle(DETACH_HANDLE detach, handle handle_value)
{
    int result;

    if (detach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        AMQP_VALUE handle_amqp_value = amqpvalue_create_handle(handle_value);
        if (handle_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(detach_instance->composite_value, 0, handle_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(handle_amqp_value);
        }
    }

    return result;
}